

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O2

QStringList * __thiscall
QtPrivate::QStringList_filter
          (QStringList *__return_storage_ptr__,QtPrivate *this,QStringList *that,QStringView str,
          CaseSensitivity cs)

{
  bool bVar1;
  QString *s;
  QString *this_00;
  long lVar2;
  QStringView s_00;
  
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  this_00 = *(QString **)(this + 8);
  for (lVar2 = *(long *)(this + 0x10) * 0x18; lVar2 != 0; lVar2 = lVar2 + -0x18) {
    s_00.m_data = (storage_type_conflict *)str.m_size;
    s_00.m_size = (qsizetype)that;
    bVar1 = QString::contains(this_00,s_00,(CaseSensitivity)str.m_data);
    if (bVar1) {
      QList<QString>::emplaceBack<QString_const&>(__return_storage_ptr__,this_00);
    }
    this_00 = this_00 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList QtPrivate::QStringList_filter(const QStringList *that, QStringView str,
                                          Qt::CaseSensitivity cs)
{
    return filter_helper(*that, str, cs);
}